

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ani2h264raw.cpp
# Opt level: O2

void parse(int argc,char **argv)

{
  OptionAdder *pOVar1;
  size_t sVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  ostream *poVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  allocator<char> local_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator<char> local_492;
  allocator<char> local_491;
  path local_490;
  path local_468;
  shared_ptr<const_cxxopts::Value> local_438;
  element_type *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_420;
  shared_ptr<const_cxxopts::Value> local_418;
  long *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  element_type *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  shared_ptr<const_cxxopts::Value> local_3e8;
  element_type *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348 [32];
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  ParseResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Options options;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,*argv,(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8," - ani files to h264 bitstream converter",
             (allocator<char> *)&local_490);
  cxxopts::Options::Options(&options,&local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"[optional args]",(allocator<char> *)&result);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&options.m_positional_help,&local_1c8);
  options.m_show_positional = true;
  std::__cxx11::string::~string((string *)&local_1c8);
  options.m_width = 0x46;
  options.m_tab_expansion = true;
  options.m_allow_unrecognised = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"",&local_491);
  cxxopts::Options::add_options((OptionAdder *)&result,&options,&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"i,input",&local_492);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"Input",&local_493);
  cxxopts::value<std::__cxx11::string>();
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_428;
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_420._M_pi;
  local_428 = (element_type *)0x0;
  _Stack_420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ANI file",&local_494);
  pOVar1 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&result,&local_490._M_pathname,&local_468._M_pathname,
                      &local_418,&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"o,output",&local_495);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Output file",&local_496);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"out.h264",&local_497);
  (**(code **)(*local_408 + 0x50))(&local_3d8,local_408,local_348);
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3d8;
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_3d0._M_pi;
  local_3d8 = (element_type *)0x0;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"raw H264 file",&local_498);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_308,&local_328,&local_438,&local_368);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"help",&local_499);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"Print help",&local_49a);
  cxxopts::value<bool>();
  local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3f8;
  local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_3f0._M_pi;
  local_3f8 = (element_type *)0x0;
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_49b);
  cxxopts::OptionAdder::operator()(pOVar1,&local_388,&local_3a8,&local_3e8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_3f0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_3d0);
  std::__cxx11::string::~string(local_348);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_420);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&result.m_keys._M_h._M_bucket_count);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"input",(allocator<char> *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result.m_keys._M_h._M_rehash_policy,"output",(allocator<char> *)&local_468);
  options_00._M_len = 2;
  options_00._M_array = (iterator)&result;
  cxxopts::Options::parse_positional(&options,options_00);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&result.m_keys._M_h._M_buckets + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  cxxopts::Options::parse(&result,&options,argc,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"help",(allocator<char> *)&local_468);
  sVar2 = cxxopts::ParseResult::count(&result,&local_490._M_pathname);
  std::__cxx11::string::~string((string *)&local_490);
  if (sVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"input",(allocator<char> *)&local_468);
    sVar2 = cxxopts::ParseResult::count(&result,&local_490._M_pathname);
    std::__cxx11::string::~string((string *)&local_490);
    if (sVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"input",(allocator<char> *)&local_468);
      pOVar3 = cxxopts::ParseResult::operator[](&result,&local_490._M_pathname);
      __source = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"output",(allocator<char> *)&local_468);
      pOVar3 = cxxopts::ParseResult::operator[](&result,&local_490._M_pathname);
      __source_00 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
      std::__cxx11::string::~string((string *)&local_490);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_490,__source,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_468,__source_00,auto_format);
      ani::extract_ani_frames(&local_490,&local_468);
      std::filesystem::__cxx11::path::~path(&local_468);
      std::filesystem::__cxx11::path::~path(&local_490);
      cxxopts::ParseResult::~ParseResult(&result);
      cxxopts::Options::~Options(&options);
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Specify input file");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_468._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_468._M_pathname._M_string_length = 0;
    local_468._M_pathname.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              (&local_490._M_pathname,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_468);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_490);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    local_468._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_468._M_pathname._M_string_length = 0;
    local_468._M_pathname.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              (&local_490._M_pathname,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_468);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_490);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&local_490);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_468);
  exit(0);
}

Assistant:

void parse(int argc, const char* argv[])
{
    try
    {
        cxxopts::Options options(argv[0], " - ani files to h264 bitstream converter");
        options
                .positional_help("[optional args]")
                .show_positional_help();

        options
                .set_width(70)
                .set_tab_expansion()
                .allow_unrecognised_options()
                .add_options()
                        ("i,input", "Input", cxxopts::value<std::string>(), "ANI file")
                        ("o,output", "Output file", cxxopts::value<std::string>()
                                ->default_value("out.h264"), "raw H264 file")
                        ("help", "Print help");

        options.parse_positional({"input", "output"});

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            exit(0);
        }

        if (!result.count("input"))
        {
            std::cout << "Specify input file" << std::endl;
            std::cout << options.help() << std::endl;
            exit(0);
        }

        const auto &input = result["input"].as<std::string>();
        const auto &output = result["output"].as<std::string>();

        ani::extract_ani_frames(input, output);

    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        exit(1);
    }
}